

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

void grain_table_entry_read
               (FILE *file,aom_internal_error_info *error_info,aom_film_grain_table_entry_t *entry)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  aom_internal_error_info *in_RSI;
  FILE *in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int n;
  int i_2;
  int i_1;
  int i;
  int num_read;
  aom_film_grain_t *pars;
  int local_68;
  int local_64;
  int local_60;
  int local_58;
  int local_54;
  int local_50;
  
  uVar1 = __isoc99_fscanf(in_RDI,"E %ld %ld %d %hd %d\n",in_RDX + 0x288,in_RDX + 0x290,in_RDX,
                          in_RDX + 0x284,in_RDX + 4);
  if ((uVar1 != 0) || (iVar2 = feof(in_RDI), iVar2 == 0)) {
    if (uVar1 == 5) {
      if (*(int *)(in_RDX + 4) != 0) {
        uVar1 = __isoc99_fscanf(in_RDI,"p %d %d %d %d %d %d %d %d %d %d %d %d\n",in_RDX + 0x128,
                                in_RDX + 0x254,in_RDX + 0x280,in_RDX + 0x124,in_RDX + 0x27c,
                                in_RDX + 0x270,in_RDX + 600,in_RDX + 0x25c,in_RDX + 0x260,
                                in_RDX + 0x264,in_RDX + 0x268,in_RDX + 0x26c);
        if (uVar1 == 0xc) {
          iVar2 = __isoc99_fscanf(in_RDI,"\tsY %d ",in_RDX + 0x78);
          if (iVar2 == 0) {
            aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read num y points");
          }
          else {
            for (local_50 = 0; local_50 < *(int *)(in_RDX + 0x78); local_50 = local_50 + 1) {
              iVar2 = __isoc99_fscanf(in_RDI,"%d %d",in_RDX + 8 + (long)local_50 * 8,
                                      in_RDX + (long)local_50 * 8 + 0xc);
              if (iVar2 != 2) {
                aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read y scaling points");
                return;
              }
            }
            iVar2 = __isoc99_fscanf(in_RDI,"\n\tsCb %d",in_RDX + 0xcc);
            if (iVar2 == 0) {
              aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read num cb points");
            }
            else {
              for (local_54 = 0; local_54 < *(int *)(in_RDX + 0xcc); local_54 = local_54 + 1) {
                iVar2 = __isoc99_fscanf(in_RDI,"%d %d",in_RDX + 0x7c + (long)local_54 * 8,
                                        in_RDX + (long)local_54 * 8 + 0x80);
                if (iVar2 != 2) {
                  aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read cb scaling points");
                  return;
                }
              }
              iVar2 = __isoc99_fscanf(in_RDI,"\n\tsCr %d",in_RDX + 0x120);
              if (iVar2 == 0) {
                aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read num cr points");
              }
              else {
                for (local_58 = 0; local_58 < *(int *)(in_RDX + 0x120); local_58 = local_58 + 1) {
                  iVar2 = __isoc99_fscanf(in_RDI,"%d %d",in_RDX + 0xd0 + (long)local_58 * 8,
                                          in_RDX + (long)local_58 * 8 + 0xd4);
                  if (iVar2 != 2) {
                    aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read cr scaling points");
                    return;
                  }
                }
                iVar2 = __isoc99_fscanf(in_RDI,"\n\tcY");
                if (iVar2 == 0) {
                  iVar2 = *(int *)(in_RDX + 0x128) * 2 * (*(int *)(in_RDX + 0x128) + 1);
                  for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
                    iVar3 = __isoc99_fscanf(in_RDI,"%d",in_RDX + 300 + (long)local_60 * 4);
                    if (iVar3 != 1) {
                      aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read Y coeffs");
                      return;
                    }
                  }
                  iVar3 = __isoc99_fscanf(in_RDI,"\n\tcCb");
                  if (iVar3 == 0) {
                    for (local_64 = 0; local_64 <= iVar2; local_64 = local_64 + 1) {
                      iVar3 = __isoc99_fscanf(in_RDI,"%d",in_RDX + 0x18c + (long)local_64 * 4);
                      if (iVar3 != 1) {
                        aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read Cb coeffs");
                        return;
                      }
                    }
                    iVar3 = __isoc99_fscanf(in_RDI,"\n\tcCr");
                    if (iVar3 == 0) {
                      for (local_68 = 0; local_68 <= iVar2; local_68 = local_68 + 1) {
                        iVar3 = __isoc99_fscanf(in_RDI,"%d",in_RDX + 0x1f0 + (long)local_68 * 4);
                        if (iVar3 != 1) {
                          aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read Cr coeffs");
                          return;
                        }
                      }
                      __isoc99_fscanf(in_RDI,"\n");
                    }
                    else {
                      aom_internal_error(in_RSI,AOM_CODEC_ERROR,
                                         "Unable read to Cr coeffs header (cCr)");
                    }
                  }
                  else {
                    aom_internal_error(in_RSI,AOM_CODEC_ERROR,
                                       "Unable to read Cb coeffs header (cCb)");
                  }
                }
                else {
                  aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read Y coeffs header (cY)");
                }
              }
            }
          }
        }
        else {
          aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read entry params. Read %d != 12",
                             (ulong)uVar1);
        }
      }
    }
    else {
      aom_internal_error(in_RSI,AOM_CODEC_ERROR,"Unable to read entry header. Read %d != 5",
                         (ulong)uVar1);
    }
  }
  return;
}

Assistant:

static void grain_table_entry_read(FILE *file,
                                   struct aom_internal_error_info *error_info,
                                   aom_film_grain_table_entry_t *entry) {
  aom_film_grain_t *pars = &entry->params;
  int num_read =
      fscanf(file, "E %" PRId64 " %" PRId64 " %d %hd %d\n", &entry->start_time,
             &entry->end_time, &pars->apply_grain, &pars->random_seed,
             &pars->update_parameters);
  if (num_read == 0 && feof(file)) return;
  if (num_read != 5) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to read entry header. Read %d != 5", num_read);
    return;
  }
  if (pars->update_parameters) {
    num_read = fscanf(file, "p %d %d %d %d %d %d %d %d %d %d %d %d\n",
                      &pars->ar_coeff_lag, &pars->ar_coeff_shift,
                      &pars->grain_scale_shift, &pars->scaling_shift,
                      &pars->chroma_scaling_from_luma, &pars->overlap_flag,
                      &pars->cb_mult, &pars->cb_luma_mult, &pars->cb_offset,
                      &pars->cr_mult, &pars->cr_luma_mult, &pars->cr_offset);
    if (num_read != 12) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable to read entry params. Read %d != 12",
                         num_read);
      return;
    }
    if (!fscanf(file, "\tsY %d ", &pars->num_y_points)) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable to read num y points");
      return;
    }
    for (int i = 0; i < pars->num_y_points; ++i) {
      if (2 != fscanf(file, "%d %d", &pars->scaling_points_y[i][0],
                      &pars->scaling_points_y[i][1])) {
        aom_internal_error(error_info, AOM_CODEC_ERROR,
                           "Unable to read y scaling points");
        return;
      }
    }
    if (!fscanf(file, "\n\tsCb %d", &pars->num_cb_points)) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable to read num cb points");
      return;
    }
    for (int i = 0; i < pars->num_cb_points; ++i) {
      if (2 != fscanf(file, "%d %d", &pars->scaling_points_cb[i][0],
                      &pars->scaling_points_cb[i][1])) {
        aom_internal_error(error_info, AOM_CODEC_ERROR,
                           "Unable to read cb scaling points");
        return;
      }
    }
    if (!fscanf(file, "\n\tsCr %d", &pars->num_cr_points)) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable to read num cr points");
      return;
    }
    for (int i = 0; i < pars->num_cr_points; ++i) {
      if (2 != fscanf(file, "%d %d", &pars->scaling_points_cr[i][0],
                      &pars->scaling_points_cr[i][1])) {
        aom_internal_error(error_info, AOM_CODEC_ERROR,
                           "Unable to read cr scaling points");
        return;
      }
    }

    if (fscanf(file, "\n\tcY")) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable to read Y coeffs header (cY)");
      return;
    }
    const int n = 2 * pars->ar_coeff_lag * (pars->ar_coeff_lag + 1);
    for (int i = 0; i < n; ++i) {
      if (1 != fscanf(file, "%d", &pars->ar_coeffs_y[i])) {
        aom_internal_error(error_info, AOM_CODEC_ERROR,
                           "Unable to read Y coeffs");
        return;
      }
    }
    if (fscanf(file, "\n\tcCb")) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable to read Cb coeffs header (cCb)");
      return;
    }
    for (int i = 0; i <= n; ++i) {
      if (1 != fscanf(file, "%d", &pars->ar_coeffs_cb[i])) {
        aom_internal_error(error_info, AOM_CODEC_ERROR,
                           "Unable to read Cb coeffs");
        return;
      }
    }
    if (fscanf(file, "\n\tcCr")) {
      aom_internal_error(error_info, AOM_CODEC_ERROR,
                         "Unable read to Cr coeffs header (cCr)");
      return;
    }
    for (int i = 0; i <= n; ++i) {
      if (1 != fscanf(file, "%d", &pars->ar_coeffs_cr[i])) {
        aom_internal_error(error_info, AOM_CODEC_ERROR,
                           "Unable to read Cr coeffs");
        return;
      }
    }
    (void)fscanf(file, "\n");
  }
}